

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_12uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  
  uVar4 = 0;
  if ((length & 0xfffffffffffffffe) != 0) {
    do {
      bVar1 = *pSrc;
      bVar2 = pSrc[1];
      bVar3 = pSrc[2];
      pSrc = pSrc + 3;
      pDst[uVar4] = (uint)(bVar2 >> 4) | (uint)bVar1 << 4;
      pDst[uVar4 + 1] = (bVar2 & 0xf) << 8 | (uint)bVar3;
      uVar4 = uVar4 + 2;
    } while (uVar4 < (length & 0xfffffffffffffffe));
  }
  if ((length & 1) != 0) {
    pDst[uVar4] = (uint)(pSrc[1] >> 4) | (uint)*pSrc << 4;
  }
  return;
}

Assistant:

static void tif_12uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)1U); i += 2U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 4) | (val1 >> 4));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0xFU) << 8) | val2);
    }
    if (length & 1U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        pDst[i + 0] = (OPJ_INT32)((val0 << 4) | (val1 >> 4));
    }
}